

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

int CS248::Collada::ColladaParser::load(char *filename,SceneInfo *sceneInfo)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  XMLElement *pXVar4;
  char *pcVar5;
  double *pdVar6;
  XMLDocument *pXVar7;
  undefined8 in_RSI;
  char *in_RDI;
  XMLElement *e_node;
  XMLElement *e_scene;
  string up_dir;
  XMLElement *up_axis;
  XMLElement *e_asset;
  XMLElement *root;
  XMLDocument doc;
  ifstream in;
  XMLElement *in_stack_00000a80;
  int in_stack_fffffffffffff888;
  int in_stack_fffffffffffff88c;
  XMLDocument *in_stack_fffffffffffff890;
  XMLDocument *in_stack_fffffffffffff898;
  undefined8 in_stack_fffffffffffff8b8;
  XMLDocument *in_stack_fffffffffffff8c0;
  allocator *paVar8;
  XMLDocument *in_stack_fffffffffffff8d0;
  XMLElement *in_stack_fffffffffffff8e0;
  allocator local_661;
  string local_660 [32];
  XMLDocument *local_640;
  allocator local_631;
  string local_630 [32];
  XMLElement *local_610;
  Vector3D local_608;
  Vector3D local_5f0;
  Vector3D local_5d8 [6];
  undefined8 uStack_548;
  allocator local_539;
  string local_538 [32];
  string *in_stack_fffffffffffffae8;
  XMLElement *in_stack_fffffffffffffaf0;
  allocator local_4e1;
  string local_4e0 [32];
  XMLElement *local_4c0;
  XMLElement *local_4b8;
  XMLDocument local_4b0;
  undefined4 local_230;
  undefined1 local_220 [520];
  undefined8 local_18;
  char *local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::ifstream::ifstream(local_220,in_RDI,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Warning: could not open file ");
    poVar3 = std::operator<<(poVar3,local_10);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
    local_230 = 1;
  }
  else {
    std::ifstream::close();
    tinyxml2::XMLDocument::XMLDocument
              (in_stack_fffffffffffff8c0,SUB81((ulong)in_stack_fffffffffffff8b8 >> 0x38,0),
               (Whitespace)in_stack_fffffffffffff8b8);
    tinyxml2::XMLDocument::LoadFile(in_stack_fffffffffffff898,(char *)in_stack_fffffffffffff890);
    bVar2 = tinyxml2::XMLDocument::Error(&local_4b0);
    if (bVar2) {
      tinyxml2::XMLDocument::PrintError(in_stack_fffffffffffff8d0);
      exit(1);
    }
    local_4b8 = tinyxml2::XMLNode::FirstChildElement
                          (&in_stack_fffffffffffff890->super_XMLNode,
                           (char *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    if (local_4b8 == (XMLElement *)0x0) {
      exit(1);
    }
    scene = local_18;
    uri_load(in_stack_fffffffffffff8e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e0,"asset",&local_4e1);
    pXVar4 = get_element(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    std::__cxx11::string::~string(local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    local_4c0 = pXVar4;
    if (pXVar4 != (XMLElement *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffaf0,"up_axis",(allocator *)&stack0xfffffffffffffaef)
      ;
      pXVar4 = get_element(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffaf0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffaef);
      if (pXVar4 == (XMLElement *)0x0) {
        exit(1);
      }
      pcVar5 = tinyxml2::XMLElement::GetText
                         ((XMLElement *)
                          CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_538,pcVar5,&local_539);
      std::allocator<char>::~allocator((allocator<char> *)&local_539);
      Matrix4x4::identity();
      transform._112_8_ = local_5d8[5].z;
      transform._120_8_ = uStack_548;
      transform._96_8_ = local_5d8[5].x;
      transform._104_8_ = local_5d8[5].y;
      transform._80_8_ = local_5d8[4].y;
      transform._88_8_ = local_5d8[4].z;
      transform._64_8_ = local_5d8[3].z;
      transform._72_8_ = local_5d8[4].x;
      transform._48_8_ = local_5d8[3].x;
      transform._56_8_ = local_5d8[3].y;
      transform._32_8_ = local_5d8[2].y;
      transform._40_8_ = local_5d8[2].z;
      transform._16_8_ = local_5d8[1].z;
      transform._24_8_ = local_5d8[2].x;
      transform._0_8_ = local_5d8[1].x;
      transform._8_8_ = local_5d8[1].y;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff890,
                              (char *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888))
      ;
      if (bVar2) {
        pdVar6 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                            in_stack_fffffffffffff888);
        *pdVar6 = 0.0;
        pdVar6 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                            in_stack_fffffffffffff888);
        *pdVar6 = 1.0;
        pdVar6 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                            in_stack_fffffffffffff888);
        *pdVar6 = 1.0;
        pdVar6 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                            in_stack_fffffffffffff888);
        *pdVar6 = 0.0;
        pdVar6 = Matrix4x4::operator()
                           ((Matrix4x4 *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                            in_stack_fffffffffffff888);
        *pdVar6 = -1.0;
        Vector3D::Vector3D(local_5d8,1.0,0.0,0.0);
        up._0_8_ = local_5d8[0].x;
        up._8_8_ = local_5d8[0].y;
        up._16_8_ = local_5d8[0].z;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff890,
                                (char *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888
                                                ));
        if (bVar2) {
          pdVar6 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                              in_stack_fffffffffffff888);
          *pdVar6 = 0.0;
          pdVar6 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                              in_stack_fffffffffffff888);
          *pdVar6 = 1.0;
          pdVar6 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                              in_stack_fffffffffffff888);
          *pdVar6 = 1.0;
          pdVar6 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                              in_stack_fffffffffffff888);
          *pdVar6 = 0.0;
          pdVar6 = Matrix4x4::operator()
                             ((Matrix4x4 *)in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                              in_stack_fffffffffffff888);
          *pdVar6 = -1.0;
          Vector3D::Vector3D(&local_5f0,0.0,0.0,1.0);
          up._0_8_ = local_5f0.x;
          up._8_8_ = local_5f0.y;
          up._16_8_ = local_5f0.z;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff890,
                                  (char *)CONCAT44(in_stack_fffffffffffff88c,
                                                   in_stack_fffffffffffff888));
          if (!bVar2) {
            exit(1);
          }
          Vector3D::Vector3D(&local_608,0.0,1.0,0.0);
          up._0_8_ = local_608.x;
          up._8_8_ = local_608.y;
          up._16_8_ = local_608.z;
        }
      }
      std::__cxx11::string::~string(local_538);
    }
    paVar8 = &local_631;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_630,"scene/instance_visual_scene",paVar8);
    pXVar4 = get_element(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    std::__cxx11::string::~string(local_630);
    std::allocator<char>::~allocator((allocator<char> *)&local_631);
    local_610 = pXVar4;
    if (pXVar4 == (XMLElement *)0x0) {
      local_4 = -1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_660,"node",&local_661);
      pXVar7 = (XMLDocument *)get_element(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      std::__cxx11::string::~string(local_660);
      std::allocator<char>::~allocator((allocator<char> *)&local_661);
      local_640 = pXVar7;
      while (local_640 != (XMLDocument *)0x0) {
        parse_node(in_stack_00000a80);
        in_stack_fffffffffffff890 =
             (XMLDocument *)
             tinyxml2::XMLNode::NextSiblingElement
                       (&in_stack_fffffffffffff890->super_XMLNode,
                        (char *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        local_640 = in_stack_fffffffffffff890;
      }
      local_4 = 0;
    }
    local_230 = 1;
    tinyxml2::XMLDocument::~XMLDocument(in_stack_fffffffffffff890);
  }
  std::ifstream::~ifstream(local_220);
  return local_4;
}

Assistant:

int ColladaParser::load(const char* filename, SceneInfo* sceneInfo) {
  ifstream in(filename);
  if (!in.is_open()) {
    cerr << "Warning: could not open file " << filename << endl;
    return -1;
  }
  in.close();

  XMLDocument doc;
  doc.LoadFile(filename);
  if (doc.Error()) {
    stat("XML error: ");
    doc.PrintError();
    exit(EXIT_FAILURE);
  }

  // Check XML schema
  XMLElement* root = doc.FirstChildElement("COLLADA");
  if (!root) {
    stat("Error: not a COLLADA file!") exit(EXIT_FAILURE);
  } else {
    stat("Loading COLLADA file...");
  }

  // Set output scene pointer
  scene = sceneInfo;

  // Build uri table
  uri_load(root);

  // Load assets - correct up direction
  if (XMLElement* e_asset = get_element(root, "asset")) {
    XMLElement* up_axis = get_element(e_asset, "up_axis");
    if (!up_axis) {
      stat("Error: No up direction defined in COLLADA file");
      exit(EXIT_FAILURE);
    }

    // get up direction and correct non-Y_UP scenes by setting a non-identity
    // global entry transformation, assuming right hand coordinate system for
    // both input and output

    string up_dir = up_axis->GetText();
    transform = Matrix4x4::identity();
    if (up_dir == "X_UP") {
      // swap X-Y and negate Z
      transform(0, 0) = 0;
      transform(0, 1) = 1;
      transform(1, 0) = 1;
      transform(1, 1) = 0;
      transform(2, 2) = -1;

      // local up direction for lights and cameras
      up = Vector3D(1, 0, 0);

    } else if (up_dir == "Z_UP") {
      // swap Z-Y matrix and negate X
      transform(1, 1) = 0;
      transform(1, 2) = 1;
      transform(2, 1) = 1;
      transform(2, 2) = 0;
      transform(0, 0) = -1;

      // local up direction cameras
      up = Vector3D(0, 0, 1);

    } else if (up_dir == "Y_UP") {
      up = Vector3D(0, 1, 0);  // no need to correct Y_UP as its used internally
    } else {
      stat("Error: invalid up direction in COLLADA file");
      exit(EXIT_FAILURE);
    }
  }

  // Load scene -
  // A scene should only have one visual_scene instance, this constraint
  // creates a one-to-one relationship between the document, the top-level
  // scene, and its visual description (COLLADA spec 1.4 page 91)
  if (XMLElement* e_scene = get_element(root, "scene/instance_visual_scene")) {
    stat("Loading scene...");

    // parse all nodes in scene
    XMLElement* e_node = get_element(e_scene, "node");
    while (e_node) {
      parse_node(e_node);
      e_node = e_node->NextSiblingElement("node");
    }

  } else {
    stat("Error: No scene description found in file:" << filename);
    return -1;
  }

  return 0;
}